

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O0

char * deqp::gls::BufferTestUtil::getBufferTargetName(deUint32 target)

{
  char *pcStack_10;
  deUint32 target_local;
  
  if (target == 0x8892) {
    pcStack_10 = "array";
  }
  else if (target == 0x8893) {
    pcStack_10 = "element_array";
  }
  else if (target == 0x88eb) {
    pcStack_10 = "pixel_pack";
  }
  else if (target == 0x88ec) {
    pcStack_10 = "pixel_unpack";
  }
  else if (target == 0x8a11) {
    pcStack_10 = "uniform";
  }
  else if (target == 0x8c2a) {
    pcStack_10 = "texture";
  }
  else if (target == 0x8c8e) {
    pcStack_10 = "transform_feedback";
  }
  else if (target == 0x8f36) {
    pcStack_10 = "copy_read";
  }
  else if (target == 0x8f37) {
    pcStack_10 = "copy_write";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* getBufferTargetName (deUint32 target)
{
	switch (target)
	{
		case GL_ARRAY_BUFFER:				return "array";
		case GL_COPY_READ_BUFFER:			return "copy_read";
		case GL_COPY_WRITE_BUFFER:			return "copy_write";
		case GL_ELEMENT_ARRAY_BUFFER:		return "element_array";
		case GL_PIXEL_PACK_BUFFER:			return "pixel_pack";
		case GL_PIXEL_UNPACK_BUFFER:		return "pixel_unpack";
		case GL_TEXTURE_BUFFER:				return "texture";
		case GL_TRANSFORM_FEEDBACK_BUFFER:	return "transform_feedback";
		case GL_UNIFORM_BUFFER:				return "uniform";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}